

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O2

uint64_t child_wid(stagewise_poly *poly,uint64_t wi_atomic,uint64_t wi_general)

{
  byte bVar1;
  vw *pvVar2;
  uint64_t uVar3;
  uint64_t *puVar4;
  uint32_t *puVar5;
  uint64_t uVar6;
  bool bVar7;
  
  uVar3 = constant_feat_masked(poly);
  uVar6 = wi_general;
  if ((uVar3 != wi_atomic) &&
     (uVar3 = constant_feat_masked(poly), uVar6 = wi_atomic, uVar3 != wi_general)) {
    pvVar2 = poly->all;
    bVar7 = (pvVar2->weights).sparse != false;
    puVar5 = &(pvVar2->weights).dense_weights._stride_shift;
    if (bVar7) {
      puVar5 = &(pvVar2->weights).sparse_weights._stride_shift;
    }
    bVar1 = (byte)*puVar5;
    puVar4 = &(pvVar2->weights).dense_weights._weight_mask;
    if (bVar7) {
      puVar4 = &(pvVar2->weights).sparse_weights._weight_mask;
    }
    uVar6 = ((wi_general >> (bVar1 & 0x3f)) * 0x1000193 ^ wi_atomic >> (bVar1 & 0x3f)) <<
            (bVar1 & 0x3f) & *puVar4;
  }
  return uVar6;
}

Assistant:

inline uint64_t child_wid(const stagewise_poly &poly, uint64_t wi_atomic, uint64_t wi_general)
{
  assert(wi_atomic == wid_mask(poly, wi_atomic));
  assert(wi_general == wid_mask(poly, wi_general));
  assert((wi_atomic & (stride_shift(poly, 1) - 1)) == 0);
  assert((wi_general & (stride_shift(poly, 1) - 1)) == 0);

  if (wi_atomic == constant_feat_masked(poly))
    return wi_general;
  else if (wi_general == constant_feat_masked(poly))
    return wi_atomic;
  else
  {
    // This is basically the "Fowler–Noll–Vo" hash.  Ideally, the hash would be invariant
    // to the monomial, whereas this here is sensitive to the path followed, but whatever.
    // the two main big differences with FNV are: (1) the "*constant" case should also have
    // a big prime (so the default hash shouldn't be identity on small things, and (2) the
    // size should not just be a power of 2, but some big prime.
    return wid_mask(
        poly, stride_shift(poly, stride_un_shift(poly, wi_atomic) ^ (16777619 * stride_un_shift(poly, wi_general))));
  }
}